

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

void DBaseDecal::SpreadRight(double r,side_t *feelwall,double wallsize,F3DFloor *ffloor)

{
  DVector2 *pDVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  DVector2 *pDVar5;
  ulong uVar6;
  line_t *plVar7;
  side_t *psVar8;
  side_t *feelwall_00;
  bool bVar9;
  double dVar10;
  double dVar11;
  double local_50;
  
  TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
  SpreadStack.Array[SpreadStack.Count] = feelwall;
  SpreadStack.Count = SpreadStack.Count + 1;
  if (wallsize < r) {
    do {
      uVar6 = (ulong)feelwall->RightSide;
      if (uVar6 == 0xffffffff) {
        return;
      }
      feelwall = sides + uVar6;
      plVar7 = sides[uVar6].linedef;
      psVar8 = plVar7->sidedef[0];
      feelwall_00 = plVar7->sidedef[1];
      if (psVar8 == feelwall) {
        if (feelwall_00 != (side_t *)0x0) goto LAB_0060a29f;
        local_50 = (wallsize + (DecalWidth - r)) - DecalLeft;
LAB_0060a347:
        dVar10 = (plVar7->delta).X;
        dVar11 = (plVar7->delta).Y;
      }
      else {
        bVar9 = feelwall_00 == feelwall;
        feelwall_00 = psVar8;
        if (psVar8 != (side_t *)0x0 && bVar9) {
LAB_0060a29f:
          if (feelwall_00->LeftSide != 0xffffffff) {
            uVar6 = (ulong)SpreadStack.Count;
            do {
              if ((int)uVar6 < 1) {
                if (uVar6 == 0) {
                  SpreadRight(r,feelwall_00,wallsize,ffloor);
                  plVar7 = feelwall->linedef;
                  psVar8 = plVar7->sidedef[0];
                }
                break;
              }
              lVar4 = uVar6 - 1;
              uVar6 = uVar6 - 1;
            } while (SpreadStack.Array[lVar4] != feelwall_00);
          }
        }
        local_50 = (wallsize + (DecalWidth - r)) - DecalLeft;
        if (psVar8 == feelwall) goto LAB_0060a347;
        pDVar1 = &plVar7->delta;
        pDVar5 = &plVar7->delta;
        plVar7 = (line_t *)&plVar7->v2;
        dVar10 = -pDVar1->X;
        dVar11 = -pDVar5->Y;
      }
      dVar2 = (plVar7->v1->p).X;
      dVar3 = (plVar7->v1->p).Y;
      wallsize = c_sqrt(dVar11 * dVar11 + dVar10 * dVar10);
      r = DecalRight - local_50;
      (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[9])
                (dVar2 - (local_50 * dVar10) / wallsize,dVar3 - (dVar11 * local_50) / wallsize,
                 SpreadZ,SpreadSource,SpreadTemplate,feelwall,ffloor);
      TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
      SpreadStack.Array[SpreadStack.Count] = feelwall;
      SpreadStack.Count = SpreadStack.Count + 1;
    } while (wallsize < r);
  }
  return;
}

Assistant:

void DBaseDecal::SpreadRight (double r, side_t *feelwall, double wallsize, F3DFloor *ffloor)
{
	vertex_t *v1;
	double x, y, ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r > wallsize && feelwall->RightSide != NO_SIDE)
	{
		feelwall = &sides[feelwall->RightSide];

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				SpreadRight (r, nextwall, wallsize, ffloor);
			}
		}

		r = DecalWidth - r + wallsize - DecalLeft;
		GetWallStuff (feelwall, v1, ldx, ldy);
		x = v1->fX();
		y = v1->fY();
		wallsize = Length (ldx, ldy);
		x -= r*ldx / wallsize;
		y -= r*ldy / wallsize;
		r = DecalRight - r;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);
	}
}